

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

ExprList * sqlite3ExprListDup(sqlite3 *db,ExprList *p,int flags)

{
  byte bVar1;
  Expr *p_00;
  ExprList *pEVar2;
  Expr *pEVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  Expr *local_38;
  
  if ((p == (ExprList *)0x0) ||
     (pEVar2 = (ExprList *)sqlite3DbMallocRawNN(db,(long)p->nExpr << 5 | 8),
     pEVar2 == (ExprList *)0x0)) {
    pEVar2 = (ExprList *)0x0;
  }
  else {
    iVar5 = p->nExpr;
    pEVar2->nExpr = iVar5;
    pEVar2->nAlloc = iVar5;
    if (0 < iVar5) {
      local_38 = (Expr *)0x0;
      lVar6 = 8;
      iVar5 = 0;
      do {
        p_00 = *(Expr **)((long)p->a + lVar6 + -8);
        if (p_00 == (Expr *)0x0) {
          *(undefined8 *)((long)pEVar2->a + lVar6 + -8) = 0;
        }
        else {
          pEVar3 = exprDup(db,p_00,flags,(u8 **)0x0);
          *(Expr **)((long)pEVar2->a + lVar6 + -8) = pEVar3;
          if (pEVar3 != (Expr *)0x0 && p_00->op == 0x9f) {
            if (pEVar3->iColumn == 0) {
              local_38 = pEVar3->pRight;
              pEVar3->pLeft = local_38;
            }
            else {
              pEVar3->pLeft = local_38;
            }
          }
        }
        pcVar4 = sqlite3DbStrDup(db,*(char **)((long)&p->a[0].pExpr + lVar6));
        *(char **)((long)&pEVar2->a[0].pExpr + lVar6) = pcVar4;
        pcVar4 = sqlite3DbStrDup(db,*(char **)((long)&p->a[0].zName + lVar6));
        *(char **)((long)&pEVar2->a[0].zName + lVar6) = pcVar4;
        *(undefined1 *)((long)&pEVar2->a[0].zSpan + lVar6) =
             *(undefined1 *)((long)&p->a[0].zSpan + lVar6);
        bVar1 = *(byte *)((long)&pEVar2->a[0].zSpan + lVar6 + 1);
        *(byte *)((long)&pEVar2->a[0].zSpan + lVar6 + 1) = bVar1 & 0xfe;
        *(byte *)((long)&pEVar2->a[0].zSpan + lVar6 + 1) =
             bVar1 & 0xfc | *(byte *)((long)&p->a[0].zSpan + lVar6 + 1) & 2;
        *(undefined4 *)((long)&pEVar2->a[0].zSpan + lVar6 + 4) =
             *(undefined4 *)((long)&p->a[0].zSpan + lVar6 + 4);
        iVar5 = iVar5 + 1;
        lVar6 = lVar6 + 0x20;
      } while (iVar5 < p->nExpr);
    }
  }
  return pEVar2;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListDup(sqlite3 *db, ExprList *p, int flags){
  ExprList *pNew;
  struct ExprList_item *pItem, *pOldItem;
  int i;
  Expr *pPriorSelectCol = 0;
  assert( db!=0 );
  if( p==0 ) return 0;
  pNew = sqlite3DbMallocRawNN(db, 
             sizeof(*pNew)+sizeof(pNew->a[0])*(p->nExpr-1) );
  if( pNew==0 ) return 0;
  pNew->nAlloc = pNew->nExpr = p->nExpr;
  pItem = pNew->a;
  pOldItem = p->a;
  for(i=0; i<p->nExpr; i++, pItem++, pOldItem++){
    Expr *pOldExpr = pOldItem->pExpr;
    Expr *pNewExpr;
    pItem->pExpr = sqlite3ExprDup(db, pOldExpr, flags);
    if( pOldExpr 
     && pOldExpr->op==TK_SELECT_COLUMN
     && (pNewExpr = pItem->pExpr)!=0 
    ){
      assert( pNewExpr->iColumn==0 || i>0 );
      if( pNewExpr->iColumn==0 ){
        assert( pOldExpr->pLeft==pOldExpr->pRight );
        pPriorSelectCol = pNewExpr->pLeft = pNewExpr->pRight;
      }else{
        assert( i>0 );
        assert( pItem[-1].pExpr!=0 );
        assert( pNewExpr->iColumn==pItem[-1].pExpr->iColumn+1 );
        assert( pPriorSelectCol==pItem[-1].pExpr->pLeft );
        pNewExpr->pLeft = pPriorSelectCol;
      }
    }
    pItem->zName = sqlite3DbStrDup(db, pOldItem->zName);
    pItem->zSpan = sqlite3DbStrDup(db, pOldItem->zSpan);
    pItem->sortOrder = pOldItem->sortOrder;
    pItem->done = 0;
    pItem->bSpanIsTab = pOldItem->bSpanIsTab;
    pItem->u = pOldItem->u;
  }
  return pNew;
}